

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::Barrier::test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  pointer context_00;
  size_type sVar1;
  reference pvVar2;
  TestContext *this;
  Archive *archive;
  float fVar3;
  ConstPixelBufferAccess local_b8;
  undefined4 local_8c;
  undefined4 local_88;
  int outPatchSize;
  int inPatchSize;
  int numPrimitives;
  TextureLevel referenceImage;
  int i;
  VkDeviceSize vertexBufferSize;
  allocator<float> local_31;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> vertexData;
  Context *context_local;
  
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)context;
  std::allocator<float>::allocator(&local_31);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30,0x20,&local_31);
  std::allocator<float>::~allocator(&local_31);
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_30);
  for (referenceImage.m_data.m_cap._4_4_ = 0; referenceImage.m_data.m_cap._4_4_ < 0x20;
      referenceImage.m_data.m_cap._4_4_ = referenceImage.m_data.m_cap._4_4_ + 1) {
    fVar3 = (float)referenceImage.m_data.m_cap._4_4_;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_30,
                        (long)referenceImage.m_data.m_cap._4_4_);
    *pvVar2 = fVar3 / 31.0;
  }
  tcu::TextureLevel::TextureLevel((TextureLevel *)&inPatchSize);
  this = Context::getTestContext
                   ((Context *)
                    vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  archive = tcu::TestContext::getArchive(this);
  tcu::ImageIO::loadPNG
            ((TextureLevel *)&inPatchSize,archive,"vulkan/data/tessellation/barrier_ref.png");
  context_00 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  outPatchSize = 1;
  local_88 = 0x20;
  local_8c = 0x20;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_30,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_b8,(TextureLevel *)&inPatchSize);
  runTest(__return_storage_ptr__,(Context *)context_00,1,0x20,0x20,VK_FORMAT_R32_SFLOAT,pvVar2,
          sVar1 << 2,&local_b8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&inPatchSize);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	// Input vertex attribute data
	std::vector<float> vertexData		(NUM_VERTICES);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < NUM_VERTICES; ++i)
		vertexData[i] = static_cast<float>(i) / (NUM_VERTICES - 1);

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/barrier_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = NUM_VERTICES;
	const int outPatchSize  = NUM_VERTICES;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}